

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_max_connections(torrent *this,int limit,bool state_update)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  error_code local_28;
  byte local_15;
  uint local_14;
  bool state_update_local;
  torrent *ptStack_10;
  int limit_local;
  torrent *this_local;
  
  local_14 = limit;
  if (limit < 1) {
    local_14 = 0xffffff;
  }
  if (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
      0xffffff) != local_14) {
    local_15 = state_update;
    ptStack_10 = this;
    if (state_update) {
      state_updated(this);
    }
    uVar2 = numeric_cast<unsigned_int,int,void>(local_14);
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfe000001ffffffff |
         ((ulong)uVar2 & 0xffffff) << 0x21;
    update_want_peers(this);
    uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if (((uVar2 & 1) != 0) && ((local_15 & 1) != 0)) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** set-max-connections: %d",
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
    }
    iVar3 = num_peers(this);
    if ((int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
             0xffffff) < iVar3) {
      iVar3 = num_peers(this);
      uVar1 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_28,too_many_connections,(type *)0x0);
      disconnect_peers(this,iVar3 - ((uint)((ulong)uVar1 >> 0x21) & 0xffffff),&local_28);
    }
    if ((local_15 & 1) != 0) {
      set_need_save_resume(this,(resume_data_flags_t)0x20);
    }
  }
  return;
}

Assistant:

void torrent::set_max_connections(int limit, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		// TODO: perhaps 0 should actually mean 0
		if (limit <= 0) limit = (1 << 24) - 1;
		if (int(m_max_connections) == limit) return;
		if (state_update) state_updated();
		m_max_connections = aux::numeric_cast<std::uint32_t>(limit);
		update_want_peers();

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && state_update)
			debug_log("*** set-max-connections: %d", m_max_connections);
#endif

		if (num_peers() > int(m_max_connections))
		{
			disconnect_peers(num_peers() - m_max_connections
				, errors::too_many_connections);
		}

		if (state_update)
			set_need_save_resume(torrent_handle::if_config_changed);
	}